

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::SparseVector::SparseVector(SparseVector *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SparseVector_003db340;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->nodes_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->nodes_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (SparseVector *)&_SparseVector_default_instance_) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

SparseVector::SparseVector()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.SparseVector)
}